

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenBlock(BinaryenModuleRef module,char *name,BinaryenExpressionRef *children,
             BinaryenIndex numChildren,BinaryenType type)

{
  Block *this;
  ulong uVar1;
  Name local_48;
  Type local_38;
  
  local_38.id = type;
  this = MixedArena::alloc<wasm::Block>(&module->allocator);
  if (name != (char *)0x0) {
    wasm::Name::Name(&local_48,name);
    (this->name).super_IString.str._M_len = local_48.super_IString.str._M_len;
    (this->name).super_IString.str._M_str = local_48.super_IString.str._M_str;
  }
  for (uVar1 = 0; numChildren != uVar1; uVar1 = uVar1 + 1) {
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(this->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               children[uVar1]);
  }
  if (local_38.id == 0xffffffffffffffff) {
    wasm::Block::finalize(this);
  }
  else {
    wasm::Block::finalize(this,local_38);
  }
  return (BinaryenExpressionRef)this;
}

Assistant:

BinaryenExpressionRef BinaryenBlock(BinaryenModuleRef module,
                                    const char* name,
                                    BinaryenExpressionRef* children,
                                    BinaryenIndex numChildren,
                                    BinaryenType type) {
  auto* ret = ((Module*)module)->allocator.alloc<Block>();
  if (name) {
    ret->name = name;
  }
  for (BinaryenIndex i = 0; i < numChildren; i++) {
    ret->list.push_back((Expression*)children[i]);
  }
  if (type != BinaryenTypeAuto()) {
    ret->finalize(Type(type));
  } else {
    ret->finalize();
  }
  return static_cast<Expression*>(ret);
}